

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O1

void vault_monsters(chunk_conflict *c,loc_conflict grid,wchar_t depth,wchar_t num)

{
  _Bool _Var1;
  wchar_t wVar2;
  int iVar3;
  wchar_t wVar4;
  loc_conflict near;
  loc local_38;
  
  _Var1 = square_in_bounds(c,(loc)grid);
  if (L'\0' < num && _Var1) {
    wVar4 = L'\0';
    do {
      iVar3 = 9;
      do {
        wVar2 = scatter_ext(c,&local_38,L'\x01',(loc)grid,L'\x01',true,square_isempty);
        if (wVar2 != L'\0') {
          pick_and_place_monster((chunk *)c,local_38,depth,true,true,'\v');
          break;
        }
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      wVar4 = wVar4 + L'\x01';
    } while (wVar4 != num);
  }
  return;
}

Assistant:

void vault_monsters(struct chunk *c, struct loc grid, int depth, int num)
{
	int k, i;

	/* If the starting location is illegal, don't even start */
	if (!square_in_bounds(c, grid)) return;

	/* Try to summon "num" monsters "near" the given location */
	for (k = 0; k < num; k++) {
		/* Try nine locations */
		for (i = 0; i < 9; i++) {
			struct loc near;

			/* Pick a nearby empty location. */
			if (scatter_ext(c, &near, 1, grid, 1, true,
					square_isempty) == 0) continue;

			/* Place the monster (allow groups) */
			pick_and_place_monster(c, near, depth, true, true,
				ORIGIN_DROP_SPECIAL);

			break;
		}
	}
}